

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_when(lysp_ctx *ctx,lysp_stmt *stmt,lysp_when **when_p)

{
  ly_stmt stmt_00;
  lysp_stmt *stmt_01;
  LY_ERR LVar1;
  LY_ERR LVar2;
  lysp_when *str_p;
  char *pcVar3;
  uint32_t substmt_index;
  ly_ctx *plVar4;
  lysp_ext_instance **in_R9;
  lysp_stmt **pplVar5;
  
  if (*when_p == (lysp_when *)0x0) {
    LVar1 = lysp_stmt_validate_value(ctx,Y_STR_ARG,stmt->arg);
    if (LVar1 == LY_SUCCESS) {
      str_p = (lysp_when *)calloc(1,0x20);
      if (str_p == (lysp_when *)0x0) {
        if (ctx == (lysp_ctx *)0x0) {
          plVar4 = (ly_ctx *)0x0;
        }
        else {
          plVar4 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar1 = LY_EMEM;
        ly_log(plVar4,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_when");
      }
      else {
        *when_p = str_p;
        if (ctx == (lysp_ctx *)0x0) {
          plVar4 = (ly_ctx *)0x0;
        }
        else {
          plVar4 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar1 = lydict_insert(plVar4,stmt->arg,0,(char **)str_p);
        if (LVar1 == LY_SUCCESS) {
          LVar1 = LY_SUCCESS;
          pplVar5 = &stmt->child;
          while (stmt_01 = *pplVar5, stmt_01 != (lysp_stmt *)0x0) {
            stmt_00 = stmt_01->kw;
            substmt_index = (int)str_p + 0x10;
            if (stmt_00 == LY_STMT_REFERENCE) {
LAB_0016a38e:
              LVar2 = lysp_stmt_text_field
                                (ctx,stmt_01,substmt_index,(char **)0x2,(yang_arg)&str_p->exts,in_R9
                                );
            }
            else {
              if (stmt_00 != LY_STMT_EXTENSION_INSTANCE) {
                substmt_index = (int)str_p + 8;
                if (stmt_00 == LY_STMT_DESCRIPTION) goto LAB_0016a38e;
                if (ctx == (lysp_ctx *)0x0) {
                  plVar4 = (ly_ctx *)0x0;
                }
                else {
                  plVar4 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar3 = lyplg_ext_stmt2str(stmt_00);
                ly_vlog(plVar4,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar3,"when");
                goto LAB_0016a2a0;
              }
              LVar2 = lysp_stmt_ext(ctx,stmt_01,LY_STMT_WHEN,0,&str_p->exts);
            }
            if (LVar2 != LY_SUCCESS) {
              return LVar2;
            }
            pplVar5 = &stmt_01->next;
          }
        }
      }
    }
  }
  else {
    if (ctx == (lysp_ctx *)0x0) {
      plVar4 = (ly_ctx *)0x0;
    }
    else {
      plVar4 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(plVar4,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","when");
LAB_0016a2a0:
    LVar1 = LY_EVALID;
  }
  return LVar1;
}

Assistant:

static LY_ERR
lysp_stmt_when(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_when **when_p)
{
    LY_ERR ret = LY_SUCCESS;
    struct lysp_when *when;

    if (*when_p) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "when");
        return LY_EVALID;
    }

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_STR_ARG, stmt->arg));

    when = calloc(1, sizeof *when);
    LY_CHECK_ERR_RET(!when, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);
    *when_p = when;

    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &when->cond));

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &when->dsc, Y_STR_ARG, &when->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &when->ref, Y_STR_ARG, &when->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_WHEN, 0, &when->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "when");
            return LY_EVALID;
        }
    }
    return ret;
}